

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorProto_ExtensionRange::MergeFrom
          (DescriptorProto_ExtensionRange *this,Message *from)

{
  DescriptorProto_ExtensionRange *pDVar1;
  DescriptorProto_ExtensionRange *in_RDI;
  DescriptorProto_ExtensionRange *unaff_retaddr;
  DescriptorProto_ExtensionRange *source;
  Message *in_stack_000003c8;
  Message *in_stack_000003d0;
  
  pDVar1 = DynamicCastToGenerated<google::protobuf::DescriptorProto_ExtensionRange>
                     (&in_RDI->super_Message);
  if (pDVar1 == (DescriptorProto_ExtensionRange *)0x0) {
    internal::ReflectionOps::Merge(in_stack_000003d0,in_stack_000003c8);
  }
  else {
    MergeFrom(unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

void DescriptorProto_ExtensionRange::MergeFrom(const ::PROTOBUF_NAMESPACE_ID::Message& from) {
// @@protoc_insertion_point(generalized_merge_from_start:google.protobuf.DescriptorProto.ExtensionRange)
  GOOGLE_DCHECK_NE(&from, this);
  const DescriptorProto_ExtensionRange* source =
      ::PROTOBUF_NAMESPACE_ID::DynamicCastToGenerated<DescriptorProto_ExtensionRange>(
          &from);
  if (source == nullptr) {
  // @@protoc_insertion_point(generalized_merge_from_cast_fail:google.protobuf.DescriptorProto.ExtensionRange)
    ::PROTOBUF_NAMESPACE_ID::internal::ReflectionOps::Merge(from, this);
  } else {
  // @@protoc_insertion_point(generalized_merge_from_cast_success:google.protobuf.DescriptorProto.ExtensionRange)
    MergeFrom(*source);
  }
}